

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.c
# Opt level: O3

void coda_za_close(za_file *zf)

{
  void *__ptr;
  int iVar1;
  za_entry *__ptr_00;
  long lVar2;
  long lVar3;
  
  close(zf->fd);
  __ptr_00 = zf->entry;
  if (__ptr_00 != (za_entry *)0x0) {
    iVar1 = zf->num_entries;
    if (0 < iVar1) {
      lVar2 = 0x28;
      lVar3 = 0;
      do {
        __ptr = *(void **)((long)&zf->entry->localheader_offset + lVar2);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          iVar1 = zf->num_entries;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x38;
      } while (lVar3 < iVar1);
      __ptr_00 = zf->entry;
    }
    free(__ptr_00);
  }
  if (zf->filename != (char *)0x0) {
    free(zf->filename);
  }
  if (zf->hash_data != (hashtable *)0x0) {
    coda_hashtable_delete(zf->hash_data);
  }
  free(zf);
  return;
}

Assistant:

void za_close(za_file *zf)
{
    close(zf->fd);
    if (zf->entry != NULL)
    {
        int i;

        for (i = 0; i < zf->num_entries; i++)
        {
            if (zf->entry[i].filename != NULL)
            {
                free(zf->entry[i].filename);
            }
        }
        free(zf->entry);
    }
    if (zf->filename != NULL)
    {
        free(zf->filename);
    }
    if (zf->hash_data != NULL)
    {
        hashtable_delete(zf->hash_data);
    }
    free(zf);
}